

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

void __thiscall Unit::operator-=(Unit *this,Unit *u)

{
  ostream *poVar1;
  int local_1c;
  int i;
  Unit *u_local;
  Unit *this_local;
  
  if ((this->bInvalid & 1U) == 0) {
    for (local_1c = 0; local_1c < 7; local_1c = local_1c + 1) {
      if (this->siUnits[local_1c] != u->siUnits[local_1c]) {
        this->bInvalid = true;
      }
    }
    if (this->nExpPrefix != u->nExpPrefix) {
      this->bInvalid = true;
    }
    if ((this->bInvalid & 1U) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"warning: trying to subtract ");
      poVar1 = std::operator<<(poVar1,(string *)&u->sUnitName);
      poVar1 = std::operator<<(poVar1," (");
      poVar1 = std::operator<<(poVar1,(string *)&u->sUnitSymbol);
      poVar1 = std::operator<<(poVar1,") from ");
      poVar1 = std::operator<<(poVar1,(string *)&this->sUnitName);
      poVar1 = std::operator<<(poVar1," (");
      poVar1 = std::operator<<(poVar1,(string *)&this->sUnitSymbol);
      poVar1 = std::operator<<(poVar1,")");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Unit::operator-=(const Unit& u)
{
	if( !bInvalid ) {
		for(int i=0; i<7; i++)
			if(siUnits[i] != u.siUnits[i])
				bInvalid = true;
		if(nExpPrefix != u.nExpPrefix)
			bInvalid = true;
	} else
		return;
	if(bInvalid)
		cout << "warning: trying to subtract "
			<< u.sUnitName << " (" << u.sUnitSymbol << ") from "
			<< sUnitName << " (" << sUnitSymbol << ")" 
			<< endl;
}